

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmetrics.cpp
# Opt level: O0

void initAndReadFile(MultiPartInputFile *in,
                    vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *outHeaders,int part,
                    vector<partData,_std::allocator<partData>_> *parts,fileMetrics *metrics,
                    bool reread)

{
  __type _Var1;
  Header *pHVar2;
  string *psVar3;
  reference pvVar4;
  vector<partData,_std::allocator<partData>_> *in_RCX;
  int in_EDX;
  vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *in_RSI;
  MultiPartInputFile *in_RDI;
  vector<partStats,_std::allocator<partStats>_> *in_R8;
  byte in_R9B;
  DeepTiledInputPart inpart_3;
  DeepScanLineInputPart inpart_2;
  TiledInputPart inpart_1;
  InputPart inpart;
  string type;
  int readPart;
  size_t p;
  partSizeData *in_stack_fffffffffffffbd8;
  partSizeData *in_stack_fffffffffffffbe0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbf8;
  reference in_stack_fffffffffffffc00;
  partSizeData *in_stack_fffffffffffffc10;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffc18;
  InputPart *in_stack_fffffffffffffc20;
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffc50;
  vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
  *in_stack_fffffffffffffc58;
  TiledInputPart *in_stack_fffffffffffffc60;
  Header *in_00;
  FrameBuffer *in_stack_fffffffffffffd30;
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd38;
  Header *in_stack_fffffffffffffd50;
  TiledInputPart *in_stack_fffffffffffffd58;
  vector<Imf_3_4::FrameBuffer,_std::allocator<Imf_3_4::FrameBuffer>_> *in_stack_fffffffffffffd60;
  vector<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>_>
  *in_stack_fffffffffffffd68;
  DeepTiledInputPart local_240 [40];
  DeepScanLineInputPart *in_stack_fffffffffffffde8;
  DeepFrameBuffer *in_stack_fffffffffffffdf0;
  vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
  *in_stack_fffffffffffffdf8;
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe00;
  DeepTiledInputPart *in_stack_fffffffffffffe08;
  DeepFrameBuffer *in_stack_fffffffffffffe10;
  vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
  *in_stack_fffffffffffffe18;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe20;
  Header *in_stack_fffffffffffffe28;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe30;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe38;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe40;
  Header *in_stack_fffffffffffffe48;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe50;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe58;
  TiledInputPart local_110 [168];
  InputPart local_68 [8];
  string local_60 [36];
  int local_3c;
  Header *local_38;
  byte local_29;
  vector<partStats,_std::allocator<partStats>_> *local_28;
  vector<partData,_std::allocator<partData>_> *local_20;
  int local_14;
  vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *local_10;
  MultiPartInputFile *local_8;
  
  local_29 = in_R9B & 1;
  local_38 = (Header *)0x0;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  while (in_00 = local_38,
        pHVar2 = (Header *)std::vector<partData,_std::allocator<partData>_>::size(local_20),
        in_00 < pHVar2) {
    pHVar2 = local_38;
    if (local_14 != -1) {
      pHVar2 = (Header *)(long)local_14;
    }
    local_3c = (int)pHVar2;
    Imf_3_4::MultiPartInputFile::header((int)local_8);
    psVar3 = (string *)Imf_3_4::Header::type_abi_cxx11_();
    std::__cxx11::string::string(local_60,psVar3);
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
    if (_Var1) {
      Imf_3_4::InputPart::InputPart(local_68,local_8,local_3c);
      std::vector<partData,_std::allocator<partData>_>::operator[](local_20,(size_type)local_38);
      std::vector<partData,_std::allocator<partData>_>::operator[](local_20,(size_type)local_38);
      std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
                (local_10,(size_type)local_38);
      initScanLine(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,(InputPart *)in_00,pHVar2);
      std::vector<partStats,_std::allocator<partStats>_>::operator[](local_28,(size_type)local_38);
      partSizeData::operator=(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
      partSizeData::~partSizeData((partSizeData *)0x115e5c);
      if ((local_29 & 1) != 0) {
        std::vector<partData,_std::allocator<partData>_>::operator[](local_20,(size_type)local_38);
        std::vector<partData,_std::allocator<partData>_>::operator[](local_20,(size_type)local_38);
        std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
                  (local_10,(size_type)local_38);
        initScanLine(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,(InputPart *)in_00,pHVar2);
        partSizeData::~partSizeData((partSizeData *)0x115efc);
      }
      std::vector<partData,_std::allocator<partData>_>::operator[](local_20,(size_type)local_38);
      std::vector<partStats,_std::allocator<partStats>_>::operator[](local_28,(size_type)local_38);
      readScanLine(in_stack_fffffffffffffc20,(FrameBuffer *)in_stack_fffffffffffffc18,
                   (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffc10);
    }
    else {
      _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
      if (_Var1) {
        Imf_3_4::TiledInputPart::TiledInputPart(local_110,local_8,local_3c);
        std::vector<partData,_std::allocator<partData>_>::operator[](local_20,(size_type)local_38);
        std::vector<partData,_std::allocator<partData>_>::operator[](local_20,(size_type)local_38);
        std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
                  (local_10,(size_type)local_38);
        initTiled(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                  in_stack_fffffffffffffd50);
        std::vector<partStats,_std::allocator<partStats>_>::operator[](local_28,(size_type)local_38)
        ;
        partSizeData::operator=(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
        partSizeData::~partSizeData((partSizeData *)0x116071);
        if ((local_29 & 1) != 0) {
          std::vector<partData,_std::allocator<partData>_>::operator[](local_20,(size_type)local_38)
          ;
          std::vector<partData,_std::allocator<partData>_>::operator[](local_20,(size_type)local_38)
          ;
          std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
                    (local_10,(size_type)local_38);
          initTiled(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                    in_stack_fffffffffffffd50);
          partSizeData::~partSizeData((partSizeData *)0x116111);
        }
        std::vector<partData,_std::allocator<partData>_>::operator[](local_20,(size_type)local_38);
        std::vector<partStats,_std::allocator<partStats>_>::operator[](local_28,(size_type)local_38)
        ;
        readTiled(in_stack_fffffffffffffc60,
                  (vector<Imf_3_4::FrameBuffer,_std::allocator<Imf_3_4::FrameBuffer>_> *)
                  in_stack_fffffffffffffc58,
                  (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffc50);
      }
      else {
        _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
        if (_Var1) {
          Imf_3_4::DeepScanLineInputPart::DeepScanLineInputPart
                    ((DeepScanLineInputPart *)&stack0xfffffffffffffe58,local_8,local_3c);
          std::vector<partData,_std::allocator<partData>_>::operator[](local_20,(size_type)local_38)
          ;
          std::vector<partData,_std::allocator<partData>_>::operator[](local_20,(size_type)local_38)
          ;
          std::vector<partData,_std::allocator<partData>_>::operator[](local_20,(size_type)local_38)
          ;
          std::vector<partData,_std::allocator<partData>_>::operator[](local_20,(size_type)local_38)
          ;
          in_stack_fffffffffffffbe0 =
               (partSizeData *)
               std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
                         (local_10,(size_type)local_38);
          std::vector<partStats,_std::allocator<partStats>_>::operator[]
                    (local_28,(size_type)local_38);
          std::vector<partStats,_std::allocator<partStats>_>::operator[]
                    (local_28,(size_type)local_38);
          in_stack_fffffffffffffbd8 = (partSizeData *)0x0;
          initAndReadDeepScanLine
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe08,
                     in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                     in_stack_fffffffffffffde8,in_stack_fffffffffffffe20,in_stack_fffffffffffffe28,
                     in_stack_fffffffffffffe30,in_stack_fffffffffffffe38);
          std::vector<partStats,_std::allocator<partStats>_>::operator[]
                    (local_28,(size_type)local_38);
          partSizeData::operator=(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
          partSizeData::~partSizeData((partSizeData *)0x116316);
          if ((local_29 & 1) != 0) {
            std::vector<partData,_std::allocator<partData>_>::operator[]
                      (local_20,(size_type)local_38);
            std::vector<partData,_std::allocator<partData>_>::operator[]
                      (local_20,(size_type)local_38);
            std::vector<partData,_std::allocator<partData>_>::operator[]
                      (local_20,(size_type)local_38);
            std::vector<partData,_std::allocator<partData>_>::operator[]
                      (local_20,(size_type)local_38);
            pvVar4 = std::vector<partData,_std::allocator<partData>_>::operator[]
                               (local_20,(size_type)local_38);
            in_stack_fffffffffffffbd8 = (partSizeData *)&(pvVar4->readBuf).deepSampleCount;
            in_stack_fffffffffffffbe0 =
                 (partSizeData *)
                 std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
                           (local_10,(size_type)local_38);
            std::vector<partStats,_std::allocator<partStats>_>::operator[]
                      (local_28,(size_type)local_38);
            std::vector<partStats,_std::allocator<partStats>_>::operator[]
                      (local_28,(size_type)local_38);
            initAndReadDeepScanLine
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe08,
                       in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0
                       ,in_stack_fffffffffffffde8,in_stack_fffffffffffffe20,
                       in_stack_fffffffffffffe28,in_stack_fffffffffffffe30,in_stack_fffffffffffffe38
                      );
            std::vector<partStats,_std::allocator<partStats>_>::operator[]
                      (local_28,(size_type)local_38);
            partSizeData::operator=(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
            partSizeData::~partSizeData((partSizeData *)0x1164be);
          }
        }
        else {
          _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
          if (_Var1) {
            Imf_3_4::DeepTiledInputPart::DeepTiledInputPart(local_240,local_8,local_3c);
            std::vector<partData,_std::allocator<partData>_>::operator[]
                      (local_20,(size_type)local_38);
            pvVar4 = std::vector<partData,_std::allocator<partData>_>::operator[]
                               (local_20,(size_type)local_38);
            in_stack_fffffffffffffc50 = &(pvVar4->readBuf).deepSampleData;
            pvVar4 = std::vector<partData,_std::allocator<partData>_>::operator[]
                               (local_20,(size_type)local_38);
            in_stack_fffffffffffffc58 = &(pvVar4->readBuf).deepSamplePtrs;
            pvVar4 = std::vector<partData,_std::allocator<partData>_>::operator[]
                               (local_20,(size_type)local_38);
            in_stack_fffffffffffffc60 = (TiledInputPart *)&(pvVar4->readBuf).deepbuf;
            in_stack_fffffffffffffbe0 =
                 (partSizeData *)
                 std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
                           (local_10,(size_type)local_38);
            std::vector<partStats,_std::allocator<partStats>_>::operator[]
                      (local_28,(size_type)local_38);
            std::vector<partStats,_std::allocator<partStats>_>::operator[]
                      (local_28,(size_type)local_38);
            in_stack_fffffffffffffbd8 = (partSizeData *)0x0;
            initAndReadDeepTiled
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe28,
                       (vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                        *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                       in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,in_stack_fffffffffffffe40
                       ,in_stack_fffffffffffffe48,in_stack_fffffffffffffe50,
                       in_stack_fffffffffffffe58);
            std::vector<partStats,_std::allocator<partStats>_>::operator[]
                      (local_28,(size_type)local_38);
            partSizeData::operator=(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
            partSizeData::~partSizeData((partSizeData *)0x116655);
            if ((local_29 & 1) != 0) {
              pvVar4 = std::vector<partData,_std::allocator<partData>_>::operator[]
                                 (local_20,(size_type)local_38);
              in_stack_fffffffffffffc18 = &(pvVar4->rereadBuf).deepSampleCount;
              pvVar4 = std::vector<partData,_std::allocator<partData>_>::operator[]
                                 (local_20,(size_type)local_38);
              in_stack_fffffffffffffc20 = (InputPart *)&(pvVar4->rereadBuf).deepSampleData;
              std::vector<partData,_std::allocator<partData>_>::operator[]
                        (local_20,(size_type)local_38);
              std::vector<partData,_std::allocator<partData>_>::operator[]
                        (local_20,(size_type)local_38);
              pvVar4 = std::vector<partData,_std::allocator<partData>_>::operator[]
                                 (local_20,(size_type)local_38);
              in_stack_fffffffffffffbd8 = (partSizeData *)&(pvVar4->readBuf).deepSampleCount;
              in_stack_fffffffffffffbe0 =
                   (partSizeData *)
                   std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
                             (local_10,(size_type)local_38);
              in_stack_fffffffffffffc00 =
                   std::vector<partStats,_std::allocator<partStats>_>::operator[]
                             (local_28,(size_type)local_38);
              std::vector<partStats,_std::allocator<partStats>_>::operator[]
                        (local_28,(size_type)local_38);
              in_stack_fffffffffffffc10 = in_stack_fffffffffffffbd8;
              initAndReadDeepTiled
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe28,
                         (vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                          *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                         in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                         in_stack_fffffffffffffe40,in_stack_fffffffffffffe48,
                         in_stack_fffffffffffffe50,in_stack_fffffffffffffe58);
              partSizeData::~partSizeData((partSizeData *)0x1167aa);
            }
          }
        }
      }
    }
    std::__cxx11::string::~string(local_60);
    local_38 = local_38 + 1;
  }
  return;
}

Assistant:

void
initAndReadFile (
    MultiPartInputFile&   in,
    const vector<Header>& outHeaders,
    int                   part,
    vector<partData>&     parts,
    fileMetrics&          metrics,
    bool                  reread)
{

    for (size_t p = 0; p < parts.size (); ++p)
    {

        int    readPart = (part == -1 ? p : part);
        string type     = in.header (readPart).type ();

        if (type == SCANLINEIMAGE)
        {
            InputPart inpart (in, readPart);
            metrics.stats[p].sizeData = initScanLine (
                parts[p].readBuf.scanlinePixelData,
                parts[p].readBuf.scanlineBuf,
                inpart,
                outHeaders[p]);
            if (reread)
            {
                initScanLine (
                    parts[p].rereadBuf.scanlinePixelData,
                    parts[p].rereadBuf.scanlineBuf,
                    inpart,
                    outHeaders[p]);
            }
            readScanLine (
                inpart,
                parts[p].readBuf.scanlineBuf,
                metrics.stats[p].readPerf);
        }
        else if (type == TILEDIMAGE)
        {
            TiledInputPart inpart (in, readPart);
            metrics.stats[p].sizeData = initTiled (
                parts[p].readBuf.tilePixelData,
                parts[p].readBuf.tiledBuf,
                inpart,
                outHeaders[p]);
            if (reread)
            {
                initTiled (
                    parts[p].rereadBuf.tilePixelData,
                    parts[p].rereadBuf.tiledBuf,
                    inpart,
                    outHeaders[p]);
            }
            readTiled (
                inpart, parts[p].readBuf.tiledBuf, metrics.stats[p].readPerf);
        }
        else if (type == DEEPSCANLINE)
        {
            DeepScanLineInputPart inpart (in, readPart);
            metrics.stats[p].sizeData = initAndReadDeepScanLine (
                parts[p].readBuf.deepSampleCount,
                parts[p].readBuf.deepSampleData,
                parts[p].readBuf.deepSamplePtrs,
                parts[p].readBuf.deepbuf,
                inpart,
                nullptr,
                outHeaders[p],
                metrics.stats[p].countReadPerf,
                metrics.stats[p].readPerf);

            if (reread)
            {
                metrics.stats[p].sizeData = initAndReadDeepScanLine (
                    parts[p].rereadBuf.deepSampleCount,
                    parts[p].rereadBuf.deepSampleData,
                    parts[p].rereadBuf.deepSamplePtrs,
                    parts[p].rereadBuf.deepbuf,
                    inpart,
                    &parts[p].readBuf.deepSampleCount,
                    outHeaders[p],
                    metrics.stats[p].countReadPerf,
                    metrics.stats[p].readPerf);
            }
        }
        else if (type == DEEPTILE)
        {
            DeepTiledInputPart inpart (in, readPart);
            metrics.stats[p].sizeData = initAndReadDeepTiled (
                parts[p].readBuf.deepSampleCount,
                parts[p].readBuf.deepSampleData,
                parts[p].readBuf.deepSamplePtrs,
                parts[p].readBuf.deepbuf,
                inpart,
                nullptr,
                outHeaders[p],
                metrics.stats[p].countReadPerf,
                metrics.stats[p].readPerf);
            if (reread)
            {
                initAndReadDeepTiled (
                    parts[p].rereadBuf.deepSampleCount,
                    parts[p].rereadBuf.deepSampleData,
                    parts[p].rereadBuf.deepSamplePtrs,
                    parts[p].rereadBuf.deepbuf,
                    inpart,
                    &parts[p].readBuf.deepSampleCount,
                    outHeaders[p],
                    metrics.stats[p].countReadPerf,
                    metrics.stats[p].readPerf);
            }
        }
    }
}